

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BReverbModel.cpp
# Opt level: O2

int __thiscall MT32Emu::BReverbModelImpl<short>::close(BReverbModelImpl<short> *this,int __fd)

{
  AllpassFilter<short> **ppAVar1;
  CombFilter<short> **ppCVar2;
  uint in_EAX;
  uint extraout_EAX;
  uint extraout_EAX_00;
  Bit32u i;
  ulong uVar3;
  
  if (this->allpasses != (AllpassFilter<short> **)0x0) {
    uVar3 = 0;
    while( true ) {
      ppAVar1 = this->allpasses;
      in_EAX = this->currentSettings->numberOfAllpasses;
      if (in_EAX <= uVar3) break;
      if (ppAVar1[uVar3] != (AllpassFilter<short> *)0x0) {
        (*(ppAVar1[uVar3]->super_RingBuffer<short>)._vptr_RingBuffer[1])();
        this->allpasses[uVar3] = (AllpassFilter<short> *)0x0;
      }
      uVar3 = uVar3 + 1;
    }
    if (ppAVar1 != (AllpassFilter<short> **)0x0) {
      operator_delete__(ppAVar1);
      in_EAX = extraout_EAX;
    }
    this->allpasses = (AllpassFilter<short> **)0x0;
  }
  if (this->combs != (CombFilter<short> **)0x0) {
    uVar3 = 0;
    while( true ) {
      ppCVar2 = this->combs;
      in_EAX = this->currentSettings->numberOfCombs;
      if (in_EAX <= uVar3) break;
      if (ppCVar2[uVar3] != (CombFilter<short> *)0x0) {
        (*(ppCVar2[uVar3]->super_RingBuffer<short>)._vptr_RingBuffer[1])();
        this->combs[uVar3] = (CombFilter<short> *)0x0;
      }
      uVar3 = uVar3 + 1;
    }
    if (ppCVar2 != (CombFilter<short> **)0x0) {
      operator_delete__(ppCVar2);
      in_EAX = extraout_EAX_00;
    }
    this->combs = (CombFilter<short> **)0x0;
  }
  return in_EAX;
}

Assistant:

void close() {
		if (allpasses != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfAllpasses; i++) {
				if (allpasses[i] != NULL) {
					delete allpasses[i];
					allpasses[i] = NULL;
				}
			}
			delete[] allpasses;
			allpasses = NULL;
		}
		if (combs != NULL) {
			for (Bit32u i = 0; i < currentSettings.numberOfCombs; i++) {
				if (combs[i] != NULL) {
					delete combs[i];
					combs[i] = NULL;
				}
			}
			delete[] combs;
			combs = NULL;
		}
	}